

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

void buildCore(VM *vm)

{
  StringBuffer *table;
  Class *pCVar1;
  uint32_t uVar2;
  anon_union_8_2_14f5a2bf_for_Value_1 objModule;
  Class *pCVar3;
  Value value;
  Method method;
  Method method_00;
  Method method_01;
  Method method_02;
  Method method_03;
  Method method_04;
  Method method_05;
  Method method_06;
  Method method_07;
  Method method_08;
  
  objModule.objHeader = &newObjModule(vm,(char *)0x0)->objHeader;
  value.field_1.objHeader = objModule.objHeader;
  value._0_8_ = 5;
  mapSet(vm,vm->allModules,(Value)ZEXT816(1),value);
  pCVar3 = defineClass(vm,(ObjModule *)objModule.objHeader,"object");
  vm->objectClass = pCVar3;
  table = &vm->allMethodNames;
  uVar2 = getIndexFromSymbolTable(table,"!",1);
  if (uVar2 == 0xffffffff) {
    uVar2 = addSymbol(vm,table,"!",1);
    pCVar3 = vm->objectClass;
  }
  method.field_1.primFn = primObjectNot;
  method._0_8_ = 1;
  bindMethod(vm,pCVar3,uVar2,method);
  uVar2 = getIndexFromSymbolTable(table,"==(_)",5);
  if (uVar2 == 0xffffffff) {
    uVar2 = addSymbol(vm,table,"==(_)",5);
  }
  method_00.field_1.primFn = primObjectEqual;
  method_00._0_8_ = 1;
  bindMethod(vm,vm->objectClass,uVar2,method_00);
  uVar2 = getIndexFromSymbolTable(table,"!=(_)",5);
  if (uVar2 == 0xffffffff) {
    uVar2 = addSymbol(vm,table,"!=(_)",5);
  }
  method_01.field_1.primFn = primObjectNotEqual;
  method_01._0_8_ = 1;
  bindMethod(vm,vm->objectClass,uVar2,method_01);
  uVar2 = getIndexFromSymbolTable(table,"is(_)",5);
  if (uVar2 == 0xffffffff) {
    uVar2 = addSymbol(vm,table,"is(_)",5);
  }
  method_02.field_1.primFn = primObjectIs;
  method_02._0_8_ = 1;
  bindMethod(vm,vm->objectClass,uVar2,method_02);
  uVar2 = getIndexFromSymbolTable(table,"toString",8);
  if (uVar2 == 0xffffffff) {
    uVar2 = addSymbol(vm,table,"toString",8);
  }
  method_03.field_1.primFn = primObjectToString;
  method_03._0_8_ = 1;
  bindMethod(vm,vm->objectClass,uVar2,method_03);
  uVar2 = getIndexFromSymbolTable(table,"type",4);
  if (uVar2 == 0xffffffff) {
    uVar2 = addSymbol(vm,table,"type",4);
  }
  method_04.field_1.primFn = primObjectType;
  method_04._0_8_ = 1;
  bindMethod(vm,vm->objectClass,uVar2,method_04);
  pCVar3 = defineClass(vm,(ObjModule *)objModule.objHeader,"class");
  vm->classOfClass = pCVar3;
  bindSuperClass(vm,pCVar3,vm->objectClass);
  uVar2 = getIndexFromSymbolTable(table,"name",4);
  if (uVar2 == 0xffffffff) {
    uVar2 = addSymbol(vm,table,"name",4);
  }
  method_05.field_1.primFn = primClassName;
  method_05._0_8_ = 1;
  bindMethod(vm,vm->classOfClass,uVar2,method_05);
  uVar2 = getIndexFromSymbolTable(table,"supertype",9);
  if (uVar2 == 0xffffffff) {
    uVar2 = addSymbol(vm,table,"supertype",9);
  }
  method_06.field_1.primFn = primClassSupertype;
  method_06._0_8_ = 1;
  bindMethod(vm,vm->classOfClass,uVar2,method_06);
  uVar2 = getIndexFromSymbolTable(table,"toString",8);
  if (uVar2 == 0xffffffff) {
    uVar2 = addSymbol(vm,table,"toString",8);
  }
  method_07.field_1.primFn = primClassToString;
  method_07._0_8_ = 1;
  bindMethod(vm,vm->classOfClass,uVar2,method_07);
  pCVar3 = defineClass(vm,(ObjModule *)objModule.objHeader,"objectMeta");
  bindSuperClass(vm,pCVar3,vm->classOfClass);
  uVar2 = getIndexFromSymbolTable(table,"same(_,_)",9);
  if (uVar2 == 0xffffffff) {
    uVar2 = addSymbol(vm,table,"same(_,_)",9);
  }
  method_08.field_1.primFn = primObjectmetaSame;
  method_08._0_8_ = 1;
  bindMethod(vm,pCVar3,uVar2,method_08);
  (vm->objectClass->objHeader).class = pCVar3;
  pCVar1 = vm->classOfClass;
  (pCVar3->objHeader).class = pCVar1;
  (pCVar1->objHeader).class = pCVar1;
  loadModule(vm,(Value)ZEXT816(1),
             "class Null {}\nclass Bool {}\nclass Num {}\nclass Fn {}\nclass Thread {}\n\nclass Sequence {\n   all(f) {\n      var result = true\n      for element (this) {\n         result = f.call(element)\n         if (!result) return result\n      }\n      return result\n   }\n\n   any(f) {\n      var result = false\n      for element (this) {\n         result = f.call(element)\n         if (result) return result\n      }\n      return result\n   }\n\n   contains(element) {\n      for item (this) if (element == item) return true\n      return false\n   }\n\n   count {\n      var result = 0\n      for element (this) result = result + 1\n      return result\n   }\n\n   count(f) {\n      var result = 0\n      for element (this) if (f.call(element)) result = result + 1\n      return result\n   }\n\n   each(f) {\n      for element (this) f.call(element)\n   }\n\n   isEmpty {\n      return iterate(null) ? false : true\n   }\n\n   map(transformation) {\n      return MapSequence.new(this, transformation)\n   }\n\n   where(predicate) {\n      return WhereSequence.new(this, predicate)\n   }\n\n   reduce(acc, f) {\n      for element (this) acc = f.call(acc, element)\n      return acc\n   }\n\n   reduce(f) {\n      var iter = iterate(null)\n      if (!iter) Thread.abort(\"Can\'t reduce an empty sequence.\")\n      var result = iteratorValue(iter)\n      while (iter = iterate(iter)) result = f.call(result, iteratorValue(iter))\n      return result\n  }\n\n   join(sep) {\n      var first = true\n      var result = \"\"\n      for element (this) {\n         if (!first) result = result + sep\n         first = false\n         result = result + element.toString\n      }\n      return result\n   }\n\n   join() {\n      return join(\"\")\n   }\n\n   toList {\n      var result = List.new()\n      for element (this) result.add(element)\n      return result\n   }\n}\n\nclass MapSequence < Sequence {\n   var sequence\n   var fn\n   new(seq, f) {\n      sequence = seq\n      fn = f\n   }\n\n  iterate(iterator) { \n     return sequence.iterate(iterator)\n  }\n  iteratorValue(iterator) {\n     return fn.call(sequence.iteratorValue(iterator))\n  }\n}\n\nclass Wher..." /* TRUNCATED STRING LITERAL */
            );
  return;
}

Assistant:

void buildCore(VM *vm) {
    // 创建核心模块
    ObjModule *coreModule = newObjModule(vm, NULL);
    mapSet(vm, vm->allModules, CORE_MODULE, OBJ_TO_VALUE(coreModule));

    // 定义object类并绑定方法
    vm->objectClass = defineClass(vm, coreModule, "object");
    PRIM_METHOD_BIND(vm->objectClass, "!", primObjectNot);
    PRIM_METHOD_BIND(vm->objectClass, "==(_)", primObjectEqual);
    PRIM_METHOD_BIND(vm->objectClass, "!=(_)", primObjectNotEqual);
    PRIM_METHOD_BIND(vm->objectClass, "is(_)", primObjectIs);
    PRIM_METHOD_BIND(vm->objectClass, "toString", primObjectToString);
    PRIM_METHOD_BIND(vm->objectClass, "type", primObjectType);

    // 定义classOfClass类,它是所有meta类的meta类和基类
    vm->classOfClass = defineClass(vm, coreModule, "class");

    // objectClass是任何类的基类
    bindSuperClass(vm, vm->classOfClass, vm->objectClass);

    PRIM_METHOD_BIND(vm->classOfClass, "name", primClassName);
    PRIM_METHOD_BIND(vm->classOfClass, "supertype", primClassSupertype);
    PRIM_METHOD_BIND(vm->classOfClass, "toString", primClassToString);

    // 定义object类的元信息类objectMetaclass, 无须挂载到vm
    Class *objectMetaclass = defineClass(vm, coreModule, "objectMeta");

    // classOfClass类是所有meta类的meta类和基类
    bindSuperClass(vm, objectMetaclass, vm->classOfClass);

    // 类型比较
    PRIM_METHOD_BIND(objectMetaclass, "same(_,_)", primObjectmetaSame);

    // 绑定各自的meta类
    vm->objectClass->objHeader.class = objectMetaclass;
    objectMetaclass->objHeader.class = vm->classOfClass;
    vm->classOfClass->objHeader.class = vm->classOfClass; // 元信息类回路,meta类终点

    // 执行核心模块
    executeModule(vm, CORE_MODULE, coreModuleCode);
}